

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O3

bool __thiscall
ddd::DictionaryMLT<false,_true>::insert_key
          (DictionaryMLT<false,_true> *this,char *key,uint32_t value)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  Query local_30;
  
  local_30.pos_ = 0;
  local_30.value_ = 0x7fffffff;
  local_30.node_pos_ = 0;
  local_30.is_finished_ = false;
  local_30.key_ = key;
  bVar2 = DaTrie<false,_true,_true>::search_prefix
                    (*(DaTrie<false,_true,_true> **)(this + 8),&local_30);
  if (!bVar2) {
    uVar3 = value;
    if (local_30.key_[local_30._8_8_ & 0xffffffff] != '\0') {
      uVar3 = new_suffix_id_(this);
    }
    local_30.value_ = uVar3;
    DaTrie<false,_true,_true>::insert_prefix_leaf
              (*(DaTrie<false,_true,_true> **)(this + 8),&local_30);
    if (local_30.is_finished_ != false) goto LAB_00120eee;
  }
  uVar1 = (ulong)local_30._8_8_ >> 0x20;
  local_30.node_pos_ = 0;
  local_30.value_ = value;
  bVar2 = DaTrie<false,_true,_false>::insert_key
                    (*(DaTrie<false,_true,_false> **)(*(long *)(this + 0x10) + uVar1 * 8),&local_30)
  ;
  if (!bVar2) {
    return false;
  }
LAB_00120eee:
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  return true;
}

Assistant:

bool insert_key(const char* key, uint32_t value) {
    assert((value >> 31) == 0);

    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      if (*query.key() != '\0') {
        query.set_value(new_suffix_id_());
      } else {
        query.set_value(value);
      }

      prefix_subtrie_->insert_prefix_leaf(query);

      if (query.is_finished()) {
        ++num_keys_;
        return true;
      }
    }

    auto suffix_id = query.value();
    query.set_node_pos(ROOT_POS);
    query.set_value(value);

    if (!suffix_subtries_[suffix_id]->insert_key(query)) {
      return false;
    }

    ++num_keys_;
    return true;
  }